

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labpack-writer.c
# Opt level: O1

void labpack_writer_destroy(labpack_writer_t *writer)

{
  writer->size = 0;
  free(writer->buffer);
  writer->buffer = (char *)0x0;
  free(writer->encoder);
  writer->encoder = (mpack_writer_t *)0x0;
  free(writer);
  return;
}

Assistant:

void
labpack_writer_destroy(labpack_writer_t* writer)
{
    writer->size = 0;
    free(writer->buffer);
    writer->buffer = NULL;
    free(writer->encoder);
    writer->encoder = NULL;
    free(writer);
}